

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

bool __thiscall
Fossilize::FeatureFilter::Impl::attachment_description2_is_supported
          (Impl *this,VkAttachmentDescription2 *desc,VkFormatFeatureFlags format_features)

{
  DeviceQueryInterface *pDVar1;
  bool bVar2;
  char cVar3;
  
  bVar2 = pnext_chain_is_supported(this,desc->pNext);
  if (((bVar2) && (bVar2 = image_layout_is_supported(this,desc->initialLayout), bVar2)) &&
     (bVar2 = image_layout_is_supported(this,desc->finalLayout), bVar2)) {
    if (((format_features != 0) && (pDVar1 = this->query, pDVar1 != (DeviceQueryInterface *)0x0)) &&
       (cVar3 = (**(code **)(*(long *)pDVar1 + 0x10))(pDVar1,desc->format,format_features),
       cVar3 == '\0')) {
      return false;
    }
    bVar2 = load_op_is_supported(this,desc->loadOp);
    if (((bVar2) && (bVar2 = load_op_is_supported(this,desc->stencilLoadOp), bVar2)) &&
       (bVar2 = store_op_is_supported(this,desc->storeOp), bVar2)) {
      bVar2 = store_op_is_supported(this,desc->stencilStoreOp);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::attachment_description2_is_supported(const VkAttachmentDescription2 &desc,
                                                               VkFormatFeatureFlags format_features) const
{
	if (!pnext_chain_is_supported(desc.pNext))
		return false;
	if (!image_layout_is_supported(desc.initialLayout))
		return false;
	if (!image_layout_is_supported(desc.finalLayout))
		return false;
	if (format_features && !format_is_supported(desc.format, format_features))
		return false;
	if (!load_op_is_supported(desc.loadOp))
		return false;
	if (!load_op_is_supported(desc.stencilLoadOp))
		return false;
	if (!store_op_is_supported(desc.storeOp))
		return false;
	if (!store_op_is_supported(desc.stencilStoreOp))
		return false;

	return true;
}